

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O2

uint32 __thiscall crnd::symbol_codec::get_bits(symbol_codec *this,uint32 num_bits)

{
  int iVar1;
  int iVar2;
  bit_buf_type bVar3;
  byte *pbVar4;
  uint uVar5;
  
  iVar1 = this->m_bit_count;
  pbVar4 = this->m_pDecode_buf_next;
  bVar3 = this->m_bit_buf;
  iVar2 = -iVar1;
  while (iVar1 < (int)num_bits) {
    if (pbVar4 == this->m_pDecode_buf_end) {
      uVar5 = 0;
    }
    else {
      this->m_pDecode_buf_next = pbVar4 + 1;
      uVar5 = (uint)*pbVar4;
      pbVar4 = pbVar4 + 1;
    }
    iVar1 = iVar1 + 8;
    this->m_bit_count = iVar1;
    bVar3 = bVar3 | uVar5 << ((char)iVar2 + 0x18U & 0x1f);
    this->m_bit_buf = bVar3;
    iVar2 = iVar2 + -8;
  }
  this->m_bit_buf = bVar3 << ((byte)num_bits & 0x1f);
  this->m_bit_count = -(iVar2 + num_bits);
  return bVar3 >> (-(byte)num_bits & 0x1f);
}

Assistant:

uint32 symbol_codec::get_bits(uint32 num_bits)
    {
        CRND_ASSERT(num_bits <= 32U);

        while (m_bit_count < (int)num_bits)
        {
            bit_buf_type c = 0;
            if (m_pDecode_buf_next != m_pDecode_buf_end)
                c = *m_pDecode_buf_next++;

            m_bit_count += 8;
            CRND_ASSERT(m_bit_count <= cBitBufSize);

            m_bit_buf |= (c << (cBitBufSize - m_bit_count));
        }

        uint32 result = static_cast<uint32>(m_bit_buf >> (cBitBufSize - num_bits));

        m_bit_buf <<= num_bits;
        m_bit_count -= num_bits;

        return result;
    }